

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_ym2612fm.c
# Opt level: O0

void FM_STATUS_SET(FM_ST *ST,int flag)

{
  int flag_local;
  FM_ST *ST_local;
  
  ST->status = ST->status | (byte)flag;
  if (((ST->irq == '\0') && ((ST->status & ST->irqmask) != 0)) &&
     (ST->irq = '\x01', ST->IRQ_Handler != (FM_IRQHANDLER)0x0)) {
    (*ST->IRQ_Handler)(ST->param,1);
  }
  return;
}

Assistant:

INLINE void FM_STATUS_SET(FM_ST *ST,int flag)
{
	/* set status flag */
	ST->status |= flag;
	if ( !(ST->irq) && (ST->status & ST->irqmask) )
	{
		ST->irq = 1;
		/* callback user interrupt handler (IRQ is OFF to ON) */
		if(ST->IRQ_Handler) (ST->IRQ_Handler)(ST->param,1);
	}
}